

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compact_optional.cpp
# Opt level: O0

void test_custom_storage(void)

{
  bool bVar1;
  reference_type pbVar2;
  allocator local_d9;
  string local_d8 [32];
  undefined1 local_b8 [8];
  opt_str osA;
  allocator local_79;
  string local_78 [32];
  undefined1 local_58 [8];
  opt_str os0;
  opt_str os_;
  
  ak_toolbox::compact_optional_ns::
  compact_optional<string_in_pair_empty_val,_ak_toolbox::compact_optional_ns::default_tag>::
  compact_optional((compact_optional<string_in_pair_empty_val,_ak_toolbox::compact_optional_ns::default_tag>
                    *)&os0.super_compact_optional_base<string_in_pair_empty_val>.super_type.value_.
                       field_0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"",&local_79);
  ak_toolbox::compact_optional_ns::
  compact_optional<string_in_pair_empty_val,_ak_toolbox::compact_optional_ns::default_tag>::
  compact_optional((compact_optional<string_in_pair_empty_val,_ak_toolbox::compact_optional_ns::default_tag>
                    *)local_58,(value_type *)local_78);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"A",&local_d9);
  ak_toolbox::compact_optional_ns::
  compact_optional<string_in_pair_empty_val,_ak_toolbox::compact_optional_ns::default_tag>::
  compact_optional((compact_optional<string_in_pair_empty_val,_ak_toolbox::compact_optional_ns::default_tag>
                    *)local_b8,(value_type *)local_d8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  bVar1 = ak_toolbox::compact_optional_ns::detail_::compact_optional_base<string_in_pair_empty_val>
          ::has_value((compact_optional_base<string_in_pair_empty_val> *)
                      &os0.super_compact_optional_base<string_in_pair_empty_val>.super_type.value_.
                       field_0x20);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!os_.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x55,"void test_custom_storage()");
  }
  bVar1 = ak_toolbox::compact_optional_ns::detail_::compact_optional_base<string_in_pair_empty_val>
          ::has_value((compact_optional_base<string_in_pair_empty_val> *)local_58);
  if (!bVar1) {
    __assert_fail("os0.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x57,"void test_custom_storage()");
  }
  pbVar2 = ak_toolbox::compact_optional_ns::detail_::compact_optional_base<string_in_pair_empty_val>
           ::value_abi_cxx11_((compact_optional_base<string_in_pair_empty_val> *)local_58);
  bVar1 = std::operator==(pbVar2,"");
  if (!bVar1) {
    __assert_fail("os0.value() == \"\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x58,"void test_custom_storage()");
  }
  bVar1 = ak_toolbox::compact_optional_ns::detail_::compact_optional_base<string_in_pair_empty_val>
          ::has_value((compact_optional_base<string_in_pair_empty_val> *)local_b8);
  if (!bVar1) {
    __assert_fail("osA.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x5a,"void test_custom_storage()");
  }
  pbVar2 = ak_toolbox::compact_optional_ns::detail_::compact_optional_base<string_in_pair_empty_val>
           ::value_abi_cxx11_((compact_optional_base<string_in_pair_empty_val> *)local_b8);
  bVar1 = std::operator==(pbVar2,"A");
  if (!bVar1) {
    __assert_fail("osA.value() == \"A\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x5b,"void test_custom_storage()");
  }
  ak_toolbox::compact_optional_ns::swap
            ((compact_optional<string_in_pair_empty_val,_ak_toolbox::compact_optional_ns::default_tag>
              *)&os0.super_compact_optional_base<string_in_pair_empty_val>.super_type.value_.
                 field_0x20,
             (compact_optional<string_in_pair_empty_val,_ak_toolbox::compact_optional_ns::default_tag>
              *)local_58);
  bVar1 = ak_toolbox::compact_optional_ns::detail_::compact_optional_base<string_in_pair_empty_val>
          ::has_value((compact_optional_base<string_in_pair_empty_val> *)
                      &os0.super_compact_optional_base<string_in_pair_empty_val>.super_type.value_.
                       field_0x20);
  if (!bVar1) {
    __assert_fail("os_.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x5f,"void test_custom_storage()");
  }
  pbVar2 = ak_toolbox::compact_optional_ns::detail_::compact_optional_base<string_in_pair_empty_val>
           ::value_abi_cxx11_((compact_optional_base<string_in_pair_empty_val> *)
                              &os0.super_compact_optional_base<string_in_pair_empty_val>.super_type.
                               value_.field_0x20);
  bVar1 = std::operator==(pbVar2,"");
  if (!bVar1) {
    __assert_fail("os_.value() == \"\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x60,"void test_custom_storage()");
  }
  bVar1 = ak_toolbox::compact_optional_ns::detail_::compact_optional_base<string_in_pair_empty_val>
          ::has_value((compact_optional_base<string_in_pair_empty_val> *)local_58);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!os0.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x61,"void test_custom_storage()");
  }
  ak_toolbox::compact_optional_ns::
  compact_optional<string_in_pair_empty_val,_ak_toolbox::compact_optional_ns::default_tag>::
  ~compact_optional((compact_optional<string_in_pair_empty_val,_ak_toolbox::compact_optional_ns::default_tag>
                     *)local_b8);
  ak_toolbox::compact_optional_ns::
  compact_optional<string_in_pair_empty_val,_ak_toolbox::compact_optional_ns::default_tag>::
  ~compact_optional((compact_optional<string_in_pair_empty_val,_ak_toolbox::compact_optional_ns::default_tag>
                     *)local_58);
  ak_toolbox::compact_optional_ns::
  compact_optional<string_in_pair_empty_val,_ak_toolbox::compact_optional_ns::default_tag>::
  ~compact_optional((compact_optional<string_in_pair_empty_val,_ak_toolbox::compact_optional_ns::default_tag>
                     *)&os0.super_compact_optional_base<string_in_pair_empty_val>.super_type.value_.
                        field_0x20);
  return;
}

Assistant:

void test_custom_storage()
{
  typedef compact_optional<string_in_pair_empty_val> opt_str;
  opt_str os_, os0(std::string("\0")), osA(std::string("A"));
  
  assert (!os_.has_value());
  
  assert (os0.has_value());
  assert (os0.value() == "");
  
  assert (osA.has_value());
  assert (osA.value() == "A");

  swap (os_, os0);
    
  assert (os_.has_value());
  assert (os_.value() == "");
  assert (!os0.has_value());
}